

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  bool bVar1;
  buffer_info *this;
  reference plVar2;
  undefined8 uVar3;
  reference pvVar4;
  uint in_EDX;
  undefined8 *in_RSI;
  PyObject *in_RDI;
  long s;
  iterator __end2_1;
  iterator __begin2_1;
  vector<long,_std::allocator<long>_> *__range2_1;
  buffer_info *info;
  handle type;
  tuple_iterator __end2;
  tuple_iterator __begin2;
  tuple *__range2;
  type_info *tinfo;
  PyTypeObject *in_stack_ffffffffffffff28;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *in_stack_ffffffffffffff30;
  handle in_stack_ffffffffffffff38;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_88;
  vector<long,_std::allocator<long>_> *local_80;
  buffer_info *local_78;
  handle local_70;
  undefined4 local_64;
  sequence_fast_readonly local_60;
  sequence_fast_readonly local_48;
  handle local_40;
  undefined1 local_38 [8];
  undefined1 *local_30;
  type_info *local_28;
  uint local_1c;
  undefined8 *local_18;
  PyObject *local_10;
  int local_4;
  
  local_28 = (type_info *)0x0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pybind11::handle::handle(&local_40,in_RDI->ob_type->tp_mro);
  pybind11::reinterpret_borrow<pybind11::tuple>(in_stack_ffffffffffffff38);
  local_30 = local_38;
  local_48.ptr = (PyObject **)pybind11::tuple::begin((tuple *)in_stack_ffffffffffffff28);
  local_60.ptr = (PyObject **)pybind11::tuple::end((tuple *)in_stack_ffffffffffffff38.m_ptr);
  while (bVar1 = pybind11::detail::operator!=
                           ((It *)in_stack_ffffffffffffff30,(It *)in_stack_ffffffffffffff28), bVar1)
  {
    local_70.m_ptr =
         (PyObject *)
         pybind11::detail::
         generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator*
                   ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *
                    )in_stack_ffffffffffffff28);
    pybind11::handle::ptr(&local_70);
    local_28 = pybind11::detail::get_type_info(in_stack_ffffffffffffff28);
    if ((local_28 != (type_info *)0x0) &&
       (local_28->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) break;
    pybind11::detail::generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
    ::operator++((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
                 in_stack_ffffffffffffff30);
  }
  local_64 = 2;
  pybind11::tuple::~tuple((tuple *)0x167030);
  if ((local_18 == (undefined8 *)0x0) ||
     ((local_28 == (type_info *)0x0 ||
      (local_28->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)))) {
    if (local_18 != (undefined8 *)0x0) {
      local_18[1] = 0;
    }
    PyErr_SetString(_PyExc_BufferError,"pybind11_getbuffer(): Internal error");
    local_4 = -1;
  }
  else {
    memset(local_18,0,0x50);
    this = (*local_28->get_buffer)(local_10,local_28->get_buffer_data);
    local_78 = this;
    if (((local_1c & 1) == 1) && ((this->readonly & 1U) != 0)) {
      if (this != (buffer_info *)0x0) {
        pybind11::buffer_info::~buffer_info(this);
        operator_delete(this,0x88);
      }
      PyErr_SetString(_PyExc_BufferError,"Writable buffer requested for readonly storage");
      local_4 = -1;
    }
    else {
      local_18[1] = local_10;
      *(undefined4 *)((long)local_18 + 0x24) = 1;
      local_18[9] = this;
      *local_18 = this->ptr;
      local_18[3] = this->itemsize;
      local_18[2] = local_18[3];
      local_80 = &this->shape;
      local_88._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff28);
      std::vector<long,_std::allocator<long>_>::end
                ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff30,
                                (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*(&local_88);
        local_18[2] = *plVar2 * local_18[2];
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  (&local_88);
      }
      *(uint *)(local_18 + 4) = (uint)(local_78->readonly & 1);
      if ((local_1c & 4) == 4) {
        uVar3 = std::__cxx11::string::c_str();
        local_18[5] = uVar3;
      }
      if ((local_1c & 0x18) == 0x18) {
        *(int *)((long)local_18 + 0x24) = (int)local_78->ndim;
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_78->strides,0);
        local_18[7] = pvVar4;
        pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&local_78->shape,0);
        local_18[6] = pvVar4;
      }
      _Py_INCREF((PyObject *)local_18[1]);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer)
            break;
    }
    if (view == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view)
            view->obj = nullptr;
        PyErr_SetString(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    if ((flags & PyBUF_WRITABLE) == PyBUF_WRITABLE && info->readonly) {
        delete info;
        // view->obj = nullptr;  // Was just memset to 0, so not necessary
        PyErr_SetString(PyExc_BufferError, "Writable buffer requested for readonly storage");
        return -1;
    }
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape)
        view->len *= s;
    view->readonly = info->readonly;
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
        view->format = const_cast<char *>(info->format.c_str());
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = &info->strides[0];
        view->shape = &info->shape[0];
    }
    Py_INCREF(view->obj);
    return 0;
}